

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_func.c
# Opt level: O2

GCfunc * lj_func_newL_gc(lua_State *L,GCproto *pt,GCfuncL *parent)

{
  TValue *pTVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  uint64_t uVar5;
  TValue *pTVar6;
  long lVar7;
  GCfunc *pGVar8;
  GCRef *pGVar9;
  GCRef *pGVar10;
  ulong uVar11;
  
  uVar5 = (L->glref).ptr64;
  if (*(ulong *)(uVar5 + 0x18) <= *(ulong *)(uVar5 + 0x10)) {
    lj_gc_step_fixtop(L);
  }
  pGVar8 = func_newL(L,pt,(GCtab *)(parent->env).gcptr64);
  bVar2 = pt->sizeuv;
  pTVar6 = L->base;
  uVar11 = 0;
  do {
    if (uVar11 == bVar2) {
      (pGVar8->c).nupvalues = bVar2;
      return pGVar8;
    }
    uVar4 = *(ushort *)((pt->uv).ptr64 + uVar11 * 2);
    if ((short)uVar4 < 0) {
      pTVar1 = pTVar6 + ((ulong)uVar4 & 0xff);
      uVar5 = (L->glref).ptr64;
      pGVar10 = &L->openupval;
      do {
        pGVar9 = (GCRef *)pGVar10->gcptr64;
        if ((pGVar9 == (GCRef *)0x0) || (*(TValue **)(pGVar9 + 4) < pTVar1)) {
          pGVar9 = (GCRef *)lj_mem_realloc(L,(void *)0x0,0,0x30);
          *(byte *)&pGVar9[1].gcptr64 = *(byte *)(uVar5 + 0x20) & 3;
          *(undefined2 *)((long)&pGVar9[1].gcptr64 + 1) = 5;
          pGVar9[4] = (GCRef)pTVar1;
          pGVar9->gcptr64 = pGVar10->gcptr64;
          pGVar10->gcptr64 = (uint64_t)pGVar9;
          pGVar9[2] = (uint64_t)(uVar5 + 0x118);
          lVar7 = *(long *)(uVar5 + 0x130);
          pGVar9[3] = (GCRef)lVar7;
          *(GCRef **)(lVar7 + 0x10) = pGVar9;
          *(GCRef **)(uVar5 + 0x130) = pGVar9;
          goto LAB_0010b028;
        }
        pGVar10 = pGVar9;
      } while (pTVar1 != *(TValue **)(pGVar9 + 4));
      bVar3 = (byte)pGVar9[1].gcptr64;
      if ((~*(byte *)(uVar5 + 0x20) & bVar3 & 3) != 0) {
        *(byte *)&pGVar9[1].gcptr64 = bVar3 ^ 3;
      }
LAB_0010b028:
      *(byte *)((long)&pGVar9[1].gcptr64 + 3) = (byte)(uVar4 >> 0xe) & 1;
      *(uint *)(pGVar9 + 5) = (uint)uVar4 << 0x18 ^ (uint)(parent->pc).ptr64;
    }
    else {
      pGVar9 = (GCRef *)parent->uvptr[uVar4].gcptr64;
    }
    *(GCRef **)((long)pGVar8 + uVar11 * 8 + 0x28) = pGVar9;
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

GCfunc *lj_func_newL_gc(lua_State *L, GCproto *pt, GCfuncL *parent)
{
  GCfunc *fn;
  GCRef *puv;
  MSize i, nuv;
  TValue *base;
  lj_gc_check_fixtop(L);
  fn = func_newL(L, pt, tabref(parent->env));
  /* NOBARRIER: The GCfunc is new (marked white). */
  puv = parent->uvptr;
  nuv = pt->sizeuv;
  base = L->base;
  for (i = 0; i < nuv; i++) {
    uint32_t v = proto_uv(pt)[i];
    GCupval *uv;
    if ((v & PROTO_UV_LOCAL)) {
      uv = func_finduv(L, base + (v & 0xff));
      uv->immutable = ((v / PROTO_UV_IMMUTABLE) & 1);
      uv->dhash = (uint32_t)(uintptr_t)mref(parent->pc, char) ^ (v << 24);
    } else {
      uv = &gcref(puv[v])->uv;
    }
    setgcref(fn->l.uvptr[i], obj2gco(uv));
  }
  fn->l.nupvalues = (uint8_t)nuv;
  return fn;
}